

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_eps(REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_STATUS RVar3;
  int iVar4;
  FILE *__stream;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT nodes [27];
  int local_40;
  int local_3c;
  REF_INT cell;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *f;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  __stream = fopen("ref_export.gnuplot","w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open ref_export.gnuplot\n");
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x6c7,
           "ref_export_eps","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"reset\n");
    fprintf(__stream,"set term postscript eps\n");
    fprintf(__stream,"set output \'%s\'\n",filename);
    fprintf(__stream,"set size ratio -1\n");
    fprintf(__stream,"set xlabel \'X\'\n");
    fprintf(__stream,"set ylabel \'Z\'\n");
    fprintf(__stream,"plot \'-\' title \'\' with lines lw 0.5\n");
    pRVar2 = ref_grid->cell[3];
    for (local_40 = 0; local_40 < pRVar2->max; local_40 = local_40 + 1) {
      RVar3 = ref_cell_nodes(pRVar2,local_40,(REF_INT *)&ref_private_status_reis_ai);
      if (RVar3 == 0) {
        for (local_3c = 0; local_3c < pRVar2->node_per; local_3c = local_3c + 1) {
          fprintf(__stream,"%25.15f %25.15f\n",pRVar1->real[nodes[(long)local_3c + -2] * 0xf],
                  pRVar1->real[nodes[(long)local_3c + -2] * 0xf + 2]);
        }
        fprintf(__stream,"%25.15f %25.15f\n",pRVar1->real[(int)ref_private_status_reis_ai * 0xf],
                pRVar1->real[(int)ref_private_status_reis_ai * 0xf + 2]);
        fprintf(__stream,"\n\n");
      }
    }
    pRVar2 = ref_grid->cell[6];
    for (local_40 = 0; local_40 < pRVar2->max; local_40 = local_40 + 1) {
      RVar3 = ref_cell_nodes(pRVar2,local_40,(REF_INT *)&ref_private_status_reis_ai);
      if (RVar3 == 0) {
        for (local_3c = 0; local_3c < pRVar2->node_per; local_3c = local_3c + 1) {
          fprintf(__stream,"%25.15f %25.15f\n",pRVar1->real[nodes[(long)local_3c + -2] * 0xf],
                  pRVar1->real[nodes[(long)local_3c + -2] * 0xf + 2]);
        }
        fprintf(__stream,"%25.15f %25.15f\n",pRVar1->real[(int)ref_private_status_reis_ai * 0xf],
                pRVar1->real[(int)ref_private_status_reis_ai * 0xf + 2]);
        fprintf(__stream,"\n\n");
      }
    }
    fprintf(__stream,"e\n");
    fclose(__stream);
    iVar4 = system("gnuplot ref_export.gnuplot");
    if ((long)iVar4 == 0) {
      iVar4 = remove("ref_export.gnuplot");
      if ((long)iVar4 == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x6ed,"ref_export_eps","temp clean up",0,(long)iVar4);
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x6ec,"ref_export_eps","gnuplot failed",0,(long)iVar4);
      ref_grid_local._4_4_ = 1;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_eps(REF_GRID ref_grid,
                                         const char *filename) {
  FILE *f;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  f = fopen("ref_export.gnuplot", "w");
  if (NULL == (void *)f) printf("unable to open ref_export.gnuplot\n");
  RNS(f, "unable to open file");

  fprintf(f, "reset\n");
  fprintf(f, "set term postscript eps\n");
  fprintf(f, "set output '%s'\n", filename);
  fprintf(f, "set size ratio -1\n");
  fprintf(f, "set xlabel 'X'\n");
  fprintf(f, "set ylabel 'Z'\n");
  fprintf(f, "plot '-' title '' with lines lw 0.5\n");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      fprintf(f, "%25.15f %25.15f\n", ref_node_xyz(ref_node, 0, nodes[node]),
              ref_node_xyz(ref_node, 2, nodes[node]));
    }
    node = 0;
    fprintf(f, "%25.15f %25.15f\n", ref_node_xyz(ref_node, 0, nodes[node]),
            ref_node_xyz(ref_node, 2, nodes[node]));
    fprintf(f, "\n\n");
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      fprintf(f, "%25.15f %25.15f\n", ref_node_xyz(ref_node, 0, nodes[node]),
              ref_node_xyz(ref_node, 2, nodes[node]));
    }
    node = 0;
    fprintf(f, "%25.15f %25.15f\n", ref_node_xyz(ref_node, 0, nodes[node]),
            ref_node_xyz(ref_node, 2, nodes[node]));
    fprintf(f, "\n\n");
  }

  fprintf(f, "e\n");
  fclose(f);

  REIS(0, system("gnuplot ref_export.gnuplot"), "gnuplot failed");
  REIS(0, remove("ref_export.gnuplot"), "temp clean up");

  return REF_SUCCESS;
}